

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pointer.cpp
# Opt level: O3

DataPointer * __thiscall duckdb::DataPointer::operator=(DataPointer *this,DataPointer *other)

{
  CompressionType CVar1;
  uint64_t uVar2;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  BlockPointer __tmp;
  BaseStatistics local_88;
  
  uVar2 = this->row_start;
  this->row_start = other->row_start;
  other->row_start = uVar2;
  uVar2 = this->tuple_count;
  this->tuple_count = other->tuple_count;
  other->tuple_count = uVar2;
  local_88.type._0_8_ = (this->block_pointer).block_id;
  local_88.type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&(this->block_pointer).offset;
  uVar6 = (other->block_pointer).offset;
  uVar7 = (other->block_pointer).unused_padding;
  (this->block_pointer).block_id = (other->block_pointer).block_id;
  (this->block_pointer).offset = uVar6;
  (this->block_pointer).unused_padding = uVar7;
  (other->block_pointer).block_id = local_88.type._0_8_;
  *(element_type **)&(other->block_pointer).offset =
       local_88.type.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  CVar1 = this->compression_type;
  this->compression_type = other->compression_type;
  other->compression_type = CVar1;
  BaseStatistics::BaseStatistics(&local_88,&this->statistics);
  BaseStatistics::operator=(&this->statistics,&other->statistics);
  BaseStatistics::operator=(&other->statistics,&local_88);
  BaseStatistics::~BaseStatistics(&local_88);
  _Var3._M_head_impl =
       (this->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (this->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
       (ColumnSegmentState *)0x0;
  _Var4._M_head_impl =
       (other->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (other->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
       (ColumnSegmentState *)0x0;
  _Var5._M_head_impl =
       (this->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (this->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var5._M_head_impl != (ColumnSegmentState *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_ColumnSegmentState + 8))();
  }
  _Var4._M_head_impl =
       (other->segment_state).
       super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
       .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
  (other->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var4._M_head_impl != (ColumnSegmentState *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_ColumnSegmentState + 8))();
  }
  return this;
}

Assistant:

DataPointer &DataPointer::operator=(DataPointer &&other) noexcept {
	std::swap(row_start, other.row_start);
	std::swap(tuple_count, other.tuple_count);
	std::swap(block_pointer, other.block_pointer);
	std::swap(compression_type, other.compression_type);
	std::swap(statistics, other.statistics);
	std::swap(segment_state, other.segment_state);
	return *this;
}